

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

void * cluster_worker(void *data)

{
  uint *puVar1;
  uint uVar2;
  MppThread *this;
  list_head *plVar3;
  list_head *plVar4;
  list_head *plVar5;
  ClusterQueue *queue;
  list_head *plVar6;
  MppThreadStatus MVar7;
  RK_S32 RVar8;
  undefined4 uVar9;
  uint uVar10;
  RK_S64 RVar11;
  RK_S64 RVar12;
  MppNodeTask *task;
  bool bVar13;
  AutoMutex autolock;
  
  this = *(MppThread **)((long)data + 0x30);
  while( true ) {
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock start\n",(char *)0x0,data);
    }
    autolock.mEnabled = 1;
    autolock.mLock = &this->mMutexCond[0].mLock;
    pthread_mutex_lock((pthread_mutex_t *)this->mMutexCond);
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock done\n",(char *)0x0,data);
    }
    MVar7 = MppThread::get_status(this,THREAD_WORK);
    if (MVar7 != MPP_THREAD_RUNNING) {
      Mutex::Autolock::~Autolock(&autolock);
      return (void *)0x0;
    }
    RVar8 = cluster_worker_get_task((ClusterWorker *)data);
    if (RVar8 == 0) {
      *(undefined4 *)((long)data + 0x38) = 0;
      MppThread::wait(this,(void *)0x0);
      *(undefined4 *)((long)data + 0x38) = 1;
    }
    Mutex::Autolock::~Autolock(&autolock);
    if ((mpp_cluster_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s run %d work start\n",(char *)0x0,data,
                 (ulong)*(uint *)((long)data + 0x40));
    }
    while (plVar6 = ((list_head *)((long)data + 0x48))->next,
          plVar6 != (list_head *)((long)data + 0x48)) {
      plVar3 = plVar6[1].next;
      plVar4 = plVar6[2].prev;
      if ((mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","%s run %s start atate %d\n",(char *)0x0,data,plVar6[1].prev,
                   *(undefined4 *)((long)&plVar3[2].next + 4));
      }
      uVar2 = *(uint *)((long)&plVar3[2].next + 4);
      if ((uVar2 & 0x10) == 0) {
        _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "node->state & (0x00000010)","cluster_worker_run_task",0x1df);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00155160;
        uVar2 = *(uint *)((long)&plVar3[2].next + 4);
      }
      if ((uVar2 & 0x10) == 0) {
        _mpp_log_l(2,"mpp_cluster","%s run state check %x is invalid on run",
                   "cluster_worker_run_task",data);
      }
      RVar11 = mpp_time();
      uVar9 = (*(code *)plVar4->next)(plVar4->prev);
      RVar12 = mpp_time();
      if ((mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","%s run %s ret %d\n",(char *)0x0,data,plVar6[1].prev,uVar9);
      }
      plVar4[1].prev = (list_head *)((long)plVar4[1].prev + (RVar12 - RVar11));
      *(int *)&plVar4[1].next = *(int *)&plVar4[1].next + 1;
      uVar2 = *(uint *)((long)&plVar3[2].next + 4);
      if ((uVar2 & 1) == 0) {
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run found destroy\n",(char *)0x0,data);
        }
        plVar4 = plVar6->next;
        plVar5 = plVar6->prev;
        plVar4->prev = plVar5;
        plVar5->next = plVar4;
        plVar6->next = plVar6;
        plVar6->prev = plVar6;
        *(undefined4 *)((long)&plVar3[4].prev + 4) = 0;
        sem_post((sem_t *)(plVar3 + 5));
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run sem post done\n",(char *)0x0,data);
        }
      }
      else if ((uVar2 & 4) == 0) {
        plVar4 = plVar6->next;
        plVar5 = plVar6->prev;
        plVar4->prev = plVar5;
        plVar5->next = plVar4;
        plVar6->next = plVar6;
        plVar6->prev = plVar6;
        do {
          uVar2 = *(uint *)((long)&plVar3[2].next + 4);
          puVar1 = (uint *)((long)&plVar3[2].next + 4);
          LOCK();
          bVar13 = uVar2 == *puVar1;
          if (bVar13) {
            *puVar1 = uVar2 ^ 0x12;
          }
          UNLOCK();
        } while (!bVar13);
        uVar10 = *(uint *)((long)&plVar3[2].next + 4);
        if ((uVar10 & 2) == 0) {
          _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "node->state & (0x00000002)","cluster_worker_run_task",0x20d);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00155160;
          uVar10 = *(uint *)((long)&plVar3[2].next + 4);
        }
        if (((uVar10 & 0x10) != 0) &&
           (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "!(node->state & (0x00000010))","cluster_worker_run_task",0x20e),
           (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00155160;
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run state %x -> %x run -> idle\n",(char *)0x0,data,
                     (ulong)uVar2,uVar2 ^ 0x12);
        }
      }
      else {
        queue = (ClusterQueue *)plVar6[2].next;
        plVar4 = plVar6->next;
        plVar5 = plVar6->prev;
        plVar4->prev = plVar5;
        plVar5->next = plVar4;
        plVar6->next = plVar6;
        plVar6->prev = plVar6;
        do {
          puVar1 = (uint *)((long)&plVar3[2].next + 4);
          LOCK();
          bVar13 = uVar2 == *puVar1;
          if (bVar13) {
            *puVar1 = uVar2 ^ 0x1c;
          }
          UNLOCK();
        } while (!bVar13);
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run state %x -> %x signal -> wait\n",(char *)0x0,data,
                     (ulong)uVar2,uVar2 ^ 0x1c);
        }
        cluster_queue_lock_f("cluster_worker_run_task",queue);
        plVar3 = (queue->list).prev;
        (queue->list).prev = plVar6;
        plVar6->next = &queue->list;
        plVar6->prev = plVar3;
        plVar3->next = plVar6;
        queue->count = queue->count + 1;
        cluster_queue_unlock_f("cluster_worker_run_task",queue);
      }
      *(int *)((long)data + 0x40) = *(int *)((long)data + 0x40) + -1;
    }
    if ((*(int *)((long)data + 0x40) != 0) &&
       (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p->work_count == 0"
                   ,"cluster_worker_run_task",0x216), (mpp_debug._3_1_ & 0x10) != 0)) break;
    if ((mpp_cluster_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s run all done\n",(char *)0x0,data);
    }
  }
LAB_00155160:
  abort();
}

Assistant:

static void *cluster_worker(void *data)
{
    ClusterWorker *p = (ClusterWorker *)data;
    MppThread *thd = p->thd;

    while (1) {
        {
            RK_S32 task_count = 0;

            cluster_dbg_lock("%s lock start\n", p->name);
            AutoMutex autolock(thd->mutex());
            cluster_dbg_lock("%s lock done\n", p->name);

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            task_count = cluster_worker_get_task(p);
            if (!task_count) {
                p->state = WORKER_IDLE;
                thd->wait();
                p->state = WORKER_RUNNING;
            }
        }

        cluster_worker_run_task(p);
    }

    return NULL;
}